

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::FunctionalTest13
          (FunctionalTest13 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"subroutines_with_separate_shader_objects",
             "Verifies that subroutines work correctly when used in separate shader objects");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dca638;
  this->m_fbo_id = 0;
  this->m_pipeline_id = 0;
  this->m_read_buffer = (uchar *)0x0;
  this->m_to_height = 4;
  this->m_to_id = 0;
  this->m_to_width = 4;
  this->m_vao_id = 0;
  this->m_has_test_passed = true;
  this->m_vs_po_ids[0] = 0;
  this->m_vs_po_ids[1] = 0;
  this->m_fs_po_ids[0] = 0;
  this->m_fs_po_ids[1] = 0;
  this->m_gs_po_ids[0] = 0;
  this->m_gs_po_ids[1] = 0;
  this->m_tc_po_ids[0] = 0;
  this->m_tc_po_ids[1] = 0;
  this->m_te_po_ids[0] = 0;
  this->m_te_po_ids[1] = 0;
  return;
}

Assistant:

FunctionalTest13::FunctionalTest13(deqp::Context& context)
	: TestCase(context, "subroutines_with_separate_shader_objects",
			   "Verifies that subroutines work correctly when used in separate "
			   "shader objects")
	, m_fbo_id(0)
	, m_pipeline_id(0)
	, m_read_buffer(DE_NULL)
	, m_to_height(4)
	, m_to_id(0)
	, m_to_width(4)
	, m_vao_id(0)
	, m_has_test_passed(true)
{
	memset(m_fs_po_ids, 0, sizeof(m_fs_po_ids));
	memset(m_gs_po_ids, 0, sizeof(m_gs_po_ids));
	memset(m_tc_po_ids, 0, sizeof(m_tc_po_ids));
	memset(m_te_po_ids, 0, sizeof(m_te_po_ids));
	memset(m_vs_po_ids, 0, sizeof(m_vs_po_ids));
}